

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.hpp
# Opt level: O1

string_type * __thiscall
toml::detail::serializer<toml::type_config>::operator()[abi_cxx11_
          (string_type *__return_storage_ptr__,serializer<toml::type_config> *this,
          local_date_type *d,local_date_format_info *param_2,source_location *param_3)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s;
  ostringstream oss;
  long *local_1b0 [2];
  long local_1a0 [2];
  ostringstream local_190 [112];
  ios_base local_120 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  toml::operator<<((ostream *)local_190,d);
  std::__cxx11::stringbuf::str();
  string_conv<std::__cxx11::string,char,std::char_traits<char>,std::allocator<char>>
            (__return_storage_ptr__,(detail *)local_1b0,s);
  if (local_1b0[0] != local_1a0) {
    operator_delete(local_1b0[0],local_1a0[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream(local_190);
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

string_type operator()(const local_date_type& d, const local_date_format_info&, const source_location&) // {{{
    {
        std::ostringstream oss;
        oss << d;
        return string_conv<string_type>(oss.str());
    }